

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O0

bool Imf_3_2::anon_unknown_0::enumsValid(Header *hdr)

{
  ulong uVar1;
  int *piVar2;
  Header *in_RDI;
  DeepImageState *typeInFile_1;
  Envmap *typeInFile;
  bool local_1;
  
  uVar1 = Imf_3_2::hasEnvmap(in_RDI);
  if ((((uVar1 & 1) == 0) || (piVar2 = (int *)Imf_3_2::envmap(in_RDI), *piVar2 == 0)) ||
     (*piVar2 == 1)) {
    uVar1 = Imf_3_2::hasDeepImageState(in_RDI);
    if (((uVar1 & 1) == 0) ||
       ((piVar2 = (int *)Imf_3_2::deepImageState(in_RDI), -1 < *piVar2 && (*piVar2 < 4)))) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
enumsValid (const Header& hdr)
{
    if (hasEnvmap (hdr))
    {

        const Envmap& typeInFile = envmap (hdr);
        if (typeInFile != ENVMAP_LATLONG && typeInFile != ENVMAP_CUBE)
        {
            return false;
        }
    }

    if (hasDeepImageState (hdr))
    {
        const DeepImageState& typeInFile = deepImageState (hdr);
        if (typeInFile < 0 || typeInFile >= DIS_NUMSTATES) { return false; }
    }

    return true;
}